

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerVariablesHelper.cxx
# Opt level: O2

Dummies * CreateDummies(Dummies *__return_storage_ptr__,string *targetName,
                       string *currentSourceDirectory,string *currentBinaryDirectory)

{
  __uniq_ptr_impl<cmState,_std::default_delete<cmState>_> this;
  cmStateSnapshot snapshot;
  cmStateDirectory cStack_78;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50._8_4_ = 2;
  local_50._0_4_ = 1;
  std::make_shared<cmake,cmake::Role,cmState::Mode>((Role *)&cStack_78,(Mode *)(local_50 + 8));
  std::__shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             (__shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2> *)&cStack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cStack_78.DirectoryState.Position);
  local_50._8_8_ =
       (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
       (((element_type *)local_50._8_8_)->State)._M_t.
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t;
  std::make_shared<cmGlobalGenerator,cmake*>((cmake **)&cStack_78);
  std::__shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->GlobalGenerator).
              super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2> *)&cStack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cStack_78.DirectoryState.Position);
  cmState::CreateBaseSnapshot
            ((cmStateSnapshot *)(local_50 + 8),
             (cmState *)
             this._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  cmStateSnapshot::GetDirectory(&cStack_78,(cmStateSnapshot *)(local_50 + 8));
  cmStateDirectory::SetCurrentSource(&cStack_78,currentSourceDirectory);
  cmStateSnapshot::GetDirectory(&cStack_78,(cmStateSnapshot *)(local_50 + 8));
  cmStateDirectory::SetCurrentBinary(&cStack_78,currentBinaryDirectory);
  local_50._0_8_ =
       (__return_storage_ptr__->GlobalGenerator).
       super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::make_shared<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&cStack_78,(cmStateSnapshot *)local_50);
  std::__shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->Makefile).
              super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2> *)&cStack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cStack_78.DirectoryState.Position);
  cmMakefile::CreateNewTarget
            ((__return_storage_ptr__->Makefile).
             super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,targetName,EXECUTABLE
             ,Yes,Normal);
  return __return_storage_ptr__;
}

Assistant:

static Dummies CreateDummies(
  std::string targetName,
  std::string currentSourceDirectory = "c:/CurrentSourceDirectory",
  std::string currentBinaryDirectory = "c:/CurrentBinaryDirectory")
{
  Dummies dummies;
  dummies.CMake =
    std::make_shared<cmake>(cmake::RoleProject, cmState::Project);
  cmState* state = dummies.CMake->GetState();
  dummies.GlobalGenerator =
    std::make_shared<cmGlobalGenerator>(dummies.CMake.get());
  cmStateSnapshot snapshot = state->CreateBaseSnapshot();
  snapshot.GetDirectory().SetCurrentSource(currentSourceDirectory);
  snapshot.GetDirectory().SetCurrentBinary(currentBinaryDirectory);
  dummies.Makefile =
    std::make_shared<cmMakefile>(dummies.GlobalGenerator.get(), snapshot);
  dummies.Makefile->CreateNewTarget(targetName, cmStateEnums::EXECUTABLE);
  return dummies;
}